

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

void __thiscall CDesign::CreateNet(CDesign *this,int iNumNet)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  CNet **ppCVar4;
  CNet **ppNet;
  int iNumNet_local;
  CDesign *this_local;
  
  this->m_iNumNet = iNumNet;
  if (this->m_ppNet == (CNet **)0x0) {
    if (this->m_iNumNet == 0) {
      __assert_fail("m_iNumNet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x44e,"void CDesign::CreateNet(int)");
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->m_iNumNet;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppCVar4 = (CNet **)operator_new__(uVar3);
    this->m_ppNet = ppCVar4;
    if (this->m_ppNet == (CNet **)0x0) {
      __assert_fail("m_ppNet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x450,"void CDesign::CreateNet(int)");
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->m_iNumNet;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppCVar4 = (CNet **)operator_new__(uVar3);
    memcpy(ppCVar4,this->m_ppNet,(long)this->m_iNumNet << 3);
    if (this->m_ppNet != (CNet **)0x0) {
      if (this->m_ppNet != (CNet **)0x0) {
        operator_delete__(this->m_ppNet);
      }
      this->m_ppNet = (CNet **)0x0;
    }
    this->m_ppNet = ppCVar4;
  }
  return;
}

Assistant:

void CDesign::CreateNet(int	iNumNet)
{
	m_iNumNet	=	iNumNet;

	if(m_ppNet)
	{
		// save some memory by removing local nets [2/13/2007 thyeros]
		CNet**	ppNet	=	new	CNet*[m_iNumNet];
		memcpy(ppNet,m_ppNet,sizeof(CNet*)*m_iNumNet);
		SAFE_DELA(m_ppNet);
		m_ppNet	=	ppNet;
	}
	else
	{
		//initialize the memory for nets
		assert(m_iNumNet);
		m_ppNet	=	new	CNet*[m_iNumNet];
		assert(m_ppNet);
	}
}